

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-netpack.c
# Opt level: O0

int lpop(lua_State *L)

{
  int iVar1;
  int *piVar2;
  int *piVar3;
  netpack *np;
  queue *q;
  lua_State *L_local;
  
  piVar2 = (int *)lua_touserdata(L,1);
  if ((piVar2 == (int *)0x0) || (piVar2[1] == piVar2[2])) {
    L_local._4_4_ = 0;
  }
  else {
    piVar3 = piVar2 + (long)piVar2[1] * 4 + 0x2004;
    iVar1 = piVar2[1];
    piVar2[1] = iVar1 + 1;
    if (*piVar2 <= iVar1 + 1) {
      piVar2[1] = 0;
    }
    lua_pushinteger(L,(long)*piVar3);
    lua_pushlightuserdata(L,*(void **)(piVar3 + 2));
    lua_pushinteger(L,(long)piVar3[1]);
    L_local._4_4_ = 3;
  }
  return L_local._4_4_;
}

Assistant:

static int
lpop(lua_State *L) {
	struct queue * q = lua_touserdata(L, 1);
	if (q == NULL || q->head == q->tail)
		return 0;
	struct netpack *np = &q->queue[q->head];
	if (++q->head >= q->cap) {
		q->head = 0;
	}
	lua_pushinteger(L, np->id);
	lua_pushlightuserdata(L, np->buffer);
	lua_pushinteger(L, np->size);

	return 3;
}